

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O0

ssize_t __thiscall Http2::FrameWriter::write(FrameWriter *this,int __fd,void *__buf,size_t __n)

{
  const_reference pvVar1;
  size_type sVar2;
  size_type sVar3;
  undefined7 uVar4;
  undefined4 in_register_00000034;
  char *__n_00;
  qint64 nWritten;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  undefined1 local_21;
  
  __n_00 = (char *)CONCAT44(in_register_00000034,__fd);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (in_stack_ffffffffffffffd0,(size_type)__n_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  sVar2 = QIODevice::write(__n_00,(longlong)pvVar1);
  uVar4 = 0;
  local_21 = false;
  if (sVar2 != 0xffffffffffffffff) {
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
    local_21 = sVar2 == sVar3;
    uVar4 = (undefined7)(sVar2 >> 8);
  }
  return CONCAT71(uVar4,local_21);
}

Assistant:

bool FrameWriter::write(QIODevice &socket) const
{
    auto &buffer = frame.buffer;
    Q_ASSERT(buffer.size() >= frameHeaderSize);
    // Do some sanity check first:

    Q_ASSERT(int(frame.type()) < int(FrameType::LAST_FRAME_TYPE));
    Q_ASSERT(frame.validateHeader() == FrameStatus::goodFrame);

    const auto nWritten = socket.write(reinterpret_cast<const char *>(&buffer[0]),
                                       buffer.size());
    return nWritten != -1 && size_type(nWritten) == buffer.size();
}